

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_retr(Curl_easy *data,curl_off_t filesize)

{
  connectdata *pcVar1;
  FTP *pFVar2;
  curl_trc_feat *pcVar3;
  long lVar4;
  CURLcode CVar5;
  long lVar6;
  char *pcVar7;
  ftpstate newstate;
  
  pcVar1 = data->conn;
  pFVar2 = (data->req).p.ftp;
  if ((((data->set).field_0x89f & 0x40) != 0) &&
     (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)) &&
      (0 < Curl_trc_feat_ftp.log_level)))) {
    if (pcVar1 == (connectdata *)0x0) {
      pcVar7 = "???";
    }
    else {
      pcVar7 = ftp_state_names[(pcVar1->proto).ftpc.state];
    }
    Curl_trc_ftp(data,"[%s] ftp_state_retr()",pcVar7);
  }
  lVar4 = (data->set).max_filesize;
  if (lVar4 < filesize && lVar4 != 0) {
    Curl_failf(data,"Maximum file size exceeded");
    return CURLE_FILESIZE_EXCEEDED;
  }
  pFVar2->downloadsize = filesize;
  lVar4 = (data->state).resume_from;
  if (lVar4 == 0) {
    CVar5 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"RETR %s",(pcVar1->proto).ftpc.file);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    newstate = ' ';
    goto LAB_0012d489;
  }
  if (filesize == -1) {
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) {
      Curl_infof(data,"ftp server does not support SIZE");
      lVar6 = pFVar2->downloadsize;
LAB_0012d3a6:
      if (lVar6 == 0) {
        Curl_xfer_setup_nop(data);
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level))
           )) {
          Curl_infof(data,"File already completely downloaded");
        }
        pFVar2->transfer = PPTRANSFER_NONE;
        newstate = '\0';
        goto LAB_0012d489;
      }
    }
  }
  else {
    if (-1 < lVar4) {
      lVar6 = filesize - lVar4;
      if (filesize < lVar4) {
LAB_0012d3ff:
        Curl_failf(data,"Offset (%ld) was beyond file size (%ld)",lVar4,filesize);
        return CURLE_BAD_DOWNLOAD_RESUME;
      }
      pFVar2->downloadsize = lVar6;
      goto LAB_0012d3a6;
    }
    if (-filesize != lVar4 && filesize <= -lVar4) goto LAB_0012d3ff;
    pFVar2->downloadsize = -lVar4;
    (data->state).resume_from = lVar4 + filesize;
  }
  if ((((data->set).field_0x89f & 0x40) != 0) &&
     ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) {
    Curl_infof(data,"Instructs server to resume from offset %ld",(data->state).resume_from);
  }
  CVar5 = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"REST %ld",(data->state).resume_from);
  if (CVar5 != CURLE_OK) {
    return CVar5;
  }
  newstate = '\x1b';
LAB_0012d489:
  _ftp_state(data,newstate);
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_state_retr(struct Curl_easy *data,
                               curl_off_t filesize)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  CURL_TRC_FTP(data, "[%s] ftp_state_retr()", FTP_DSTATE(data));
  if(data->set.max_filesize && (filesize > data->set.max_filesize)) {
    failf(data, "Maximum file size exceeded");
    return CURLE_FILESIZE_EXCEEDED;
  }
  ftp->downloadsize = filesize;

  if(data->state.resume_from) {
    /* We always (attempt to) get the size of downloads, so it is done before
       this even when not doing resumes. */
    if(filesize == -1) {
      infof(data, "ftp server does not support SIZE");
      /* We could not get the size and therefore we cannot know if there really
         is a part of the file left to get, although the server will just
         close the connection when we start the connection so it will not cause
         us any harm, just not make us exit as nicely. */
    }
    else {
      /* We got a file size report, so we check that there actually is a
         part of the file left to get, or else we go home.  */
      if(data->state.resume_from < 0) {
        /* We are supposed to download the last abs(from) bytes */
        if(filesize < -data->state.resume_from) {
          failf(data, "Offset (%" FMT_OFF_T
                ") was beyond file size (%" FMT_OFF_T ")",
                data->state.resume_from, filesize);
          return CURLE_BAD_DOWNLOAD_RESUME;
        }
        /* convert to size to download */
        ftp->downloadsize = -data->state.resume_from;
        /* download from where? */
        data->state.resume_from = filesize - ftp->downloadsize;
      }
      else {
        if(filesize < data->state.resume_from) {
          failf(data, "Offset (%" FMT_OFF_T
                ") was beyond file size (%" FMT_OFF_T ")",
                data->state.resume_from, filesize);
          return CURLE_BAD_DOWNLOAD_RESUME;
        }
        /* Now store the number of bytes we are expected to download */
        ftp->downloadsize = filesize-data->state.resume_from;
      }
    }

    if(ftp->downloadsize == 0) {
      /* no data to transfer */
      Curl_xfer_setup_nop(data);
      infof(data, "File already completely downloaded");

      /* Set ->transfer so that we will not get any error in ftp_done()
       * because we did not transfer the any file */
      ftp->transfer = PPTRANSFER_NONE;
      ftp_state(data, FTP_STOP);
      return CURLE_OK;
    }

    /* Set resume file transfer offset */
    infof(data, "Instructs server to resume from offset %" FMT_OFF_T,
          data->state.resume_from);

    result = Curl_pp_sendf(data, &ftpc->pp, "REST %" FMT_OFF_T,
                           data->state.resume_from);
    if(!result)
      ftp_state(data, FTP_RETR_REST);
  }
  else {
    /* no resume */
    result = Curl_pp_sendf(data, &ftpc->pp, "RETR %s", ftpc->file);
    if(!result)
      ftp_state(data, FTP_RETR);
  }

  return result;
}